

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::FieldOptions::ByteSize(FieldOptions *this)

{
  bool bVar1;
  FieldOptions_CType value;
  int iVar2;
  string *value_00;
  UninterpretedOption *value_01;
  UnknownFieldSet *pUVar3;
  int local_18;
  int local_14;
  int i;
  int total_size;
  FieldOptions *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_ctype(this);
    if (bVar1) {
      value = ctype(this);
      local_14 = internal::WireFormatLite::EnumSize(value);
      local_14 = local_14 + 1;
    }
    bVar1 = has_packed(this);
    if (bVar1) {
      local_14 = local_14 + 2;
    }
    bVar1 = has_lazy(this);
    if (bVar1) {
      local_14 = local_14 + 2;
    }
    bVar1 = has_deprecated(this);
    if (bVar1) {
      local_14 = local_14 + 2;
    }
    bVar1 = has_experimental_map_key(this);
    if (bVar1) {
      value_00 = experimental_map_key_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(value_00);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_weak(this);
    if (bVar1) {
      local_14 = local_14 + 2;
    }
  }
  iVar2 = uninterpreted_option_size(this);
  local_14 = iVar2 * 2 + local_14;
  for (local_18 = 0; iVar2 = uninterpreted_option_size(this), local_18 < iVar2;
      local_18 = local_18 + 1) {
    value_01 = uninterpreted_option(this,local_18);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value_01);
    local_14 = iVar2 + local_14;
  }
  iVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  local_14 = iVar2 + local_14;
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar3);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int FieldOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional string experimental_map_key = 9;
    if (has_experimental_map_key()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->experimental_map_key());
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}